

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall JetHead::Socket::write(Socket *this)

{
  size_t in_RCX;
  uint in_EDX;
  int in_ESI;
  
  write((Socket *)(this[-1].mLastDatagramSender.mName + 8),in_ESI,(void *)(ulong)in_EDX,in_RCX);
  return;
}

Assistant:

int Socket::write( const void *buffer, int len )
{
	// Passing in the MSG_NOSIGNAL flag to tell the OS not to send us
	// SIGPIPE when the socket is closed during this call.  At some
	// point we might make this a member variable that can be tweaked
	// by the user, but that's interface clutter that we don't need
	// yet.
	return ::send(mFd, buffer, len, MSG_NOSIGNAL);
}